

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HBondPersistence.cpp
# Opt level: O3

void __thiscall OpenMD::HBondPersistence::computeFrame(HBondPersistence *this,int istep)

{
  double *pdVar1;
  vector<int,std::allocator<int>> *pvVar2;
  double dVar3;
  HBondDonor *pHVar4;
  Atom *pAVar5;
  pointer pvVar6;
  iterator iVar7;
  double dVar8;
  uint i;
  Molecule *pMVar9;
  Molecule *pMVar10;
  long lVar11;
  pointer ppHVar12;
  pointer ppAVar13;
  long lVar14;
  double tmp;
  int aInd;
  int hInd;
  Vector<double,_3U> result;
  Vector3d DA;
  Vector3d DH;
  int jj;
  int ii;
  Vector3d HA;
  Vector3d hPos;
  Vector3d aPos;
  Vector3d dPos;
  int local_150;
  int local_14c;
  SelectionSet local_148;
  double local_128;
  double local_120;
  Vector3d local_118;
  Vector3d local_f8;
  double local_d8;
  int local_d0;
  int local_cc;
  Vector3d local_c8;
  double local_a8 [4];
  double local_88 [4];
  double local_68 [3];
  SelectionManager *local_50;
  long local_48;
  long local_40;
  SelectionManager *local_38;
  
  local_68[0] = 0.0;
  local_68[1] = 0.0;
  local_68[2] = 0.0;
  local_88[2] = 0.0;
  local_88[0] = 0.0;
  local_88[1] = 0.0;
  local_a8[2] = 0.0;
  local_a8[0] = 0.0;
  local_a8[1] = 0.0;
  local_f8.super_Vector<double,_3U>.data_[2] = 0.0;
  local_f8.super_Vector<double,_3U>.data_[0] = 0.0;
  local_f8.super_Vector<double,_3U>.data_[1] = 0.0;
  local_118.super_Vector<double,_3U>.data_[2] = 0.0;
  local_118.super_Vector<double,_3U>.data_[0] = 0.0;
  local_118.super_Vector<double,_3U>.data_[1] = 0.0;
  local_c8.super_Vector<double,_3U>.data_[2] = 0.0;
  local_c8.super_Vector<double,_3U>.data_[0] = 0.0;
  local_c8.super_Vector<double,_3U>.data_[1] = 0.0;
  local_40 = (long)istep;
  local_48 = local_40 * 3;
  local_148.bitsets_.super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_148.bitsets_.
                         super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,0xffffffff);
  std::vector<int,_std::allocator<int>_>::resize
            ((this->GIDtoDonor_).
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + local_40,
             (long)((this->super_TimeCorrFunc<double>).info_)->nGlobalAtoms_,
             (value_type_conflict2 *)&local_148);
  if ((this->super_TimeCorrFunc<double>).uniqueSelections_ == false) {
    (this->super_TimeCorrFunc<double>).seleMan2_.info_ =
         (this->super_TimeCorrFunc<double>).seleMan1_.info_;
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::operator=
              (&(this->super_TimeCorrFunc<double>).seleMan2_.ss_.bitsets_,
               &(this->super_TimeCorrFunc<double>).seleMan1_.ss_.bitsets_);
    std::vector<int,_std::allocator<int>_>::operator=
              (&(this->super_TimeCorrFunc<double>).seleMan2_.nObjects_,
               &(this->super_TimeCorrFunc<double>).seleMan1_.nObjects_);
    std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::operator=
              (&(this->super_TimeCorrFunc<double>).seleMan2_.stuntdoubles_,
               &(this->super_TimeCorrFunc<double>).seleMan1_.stuntdoubles_);
    std::vector<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>::operator=
              (&(this->super_TimeCorrFunc<double>).seleMan2_.bonds_,
               &(this->super_TimeCorrFunc<double>).seleMan1_.bonds_);
    std::vector<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>::operator=
              (&(this->super_TimeCorrFunc<double>).seleMan2_.bends_,
               &(this->super_TimeCorrFunc<double>).seleMan1_.bends_);
    std::vector<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>::operator=
              (&(this->super_TimeCorrFunc<double>).seleMan2_.torsions_,
               &(this->super_TimeCorrFunc<double>).seleMan1_.torsions_);
    std::vector<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>::operator=
              (&(this->super_TimeCorrFunc<double>).seleMan2_.inversions_,
               &(this->super_TimeCorrFunc<double>).seleMan1_.inversions_);
    std::vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>::operator=
              (&(this->super_TimeCorrFunc<double>).seleMan2_.molecules_,
               &(this->super_TimeCorrFunc<double>).seleMan1_.molecules_);
  }
  if ((this->super_TimeCorrFunc<double>).evaluator1_.isDynamic_ == true) {
    SelectionEvaluator::evaluate(&local_148,&(this->super_TimeCorrFunc<double>).evaluator1_);
    lVar14 = 0;
    do {
      std::vector<bool,_std::allocator<bool>_>::operator=
                ((vector<bool,_std::allocator<bool>_> *)
                 ((long)&(((this->super_TimeCorrFunc<double>).seleMan1_.ss_.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                         super__Bvector_base<std::allocator<bool>_> + lVar14),
                 (vector<bool,_std::allocator<bool>_> *)
                 ((long)&((local_148.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                         super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                         ._M_start.super__Bit_iterator_base._M_p + lVar14));
      lVar14 = lVar14 + 0x28;
    } while (lVar14 != 0xf0);
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
              (&local_148.bitsets_);
  }
  if (((this->super_TimeCorrFunc<double>).uniqueSelections_ == true) &&
     ((this->super_TimeCorrFunc<double>).evaluator2_.isDynamic_ == true)) {
    SelectionEvaluator::evaluate(&local_148,&(this->super_TimeCorrFunc<double>).evaluator2_);
    lVar14 = 0;
    do {
      std::vector<bool,_std::allocator<bool>_>::operator=
                ((vector<bool,_std::allocator<bool>_> *)
                 ((long)&(((this->super_TimeCorrFunc<double>).seleMan2_.ss_.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                         super__Bvector_base<std::allocator<bool>_> + lVar14),
                 (vector<bool,_std::allocator<bool>_> *)
                 ((long)&((local_148.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                         super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                         ._M_start.super__Bit_iterator_base._M_p + lVar14));
      lVar14 = lVar14 + 0x28;
    } while (lVar14 != 0xf0);
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
              (&local_148.bitsets_);
  }
  local_38 = &(this->super_TimeCorrFunc<double>).seleMan1_;
  pMVar9 = SelectionManager::beginSelectedMolecule(local_38,&local_cc);
  if (pMVar9 != (Molecule *)0x0) {
    local_50 = &(this->super_TimeCorrFunc<double>).seleMan2_;
    do {
      pMVar10 = SelectionManager::beginSelectedMolecule(local_50,&local_d0);
      while (pMVar10 != (Molecule *)0x0) {
        for (ppHVar12 = (pMVar9->hBondDonors_).
                        super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            (ppHVar12 !=
             (pMVar9->hBondDonors_).
             super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
             ._M_impl.super__Vector_impl_data._M_finish &&
            (pHVar4 = *ppHVar12, pHVar4 != (HBondDonor *)0x0)); ppHVar12 = ppHVar12 + 1) {
          pAVar5 = pHVar4->donorAtom;
          lVar11 = (long)(pAVar5->super_StuntDouble).localIndex_;
          lVar14 = *(long *)((long)&(((pAVar5->super_StuntDouble).snapshotMan_)->currentSnapshot_->
                                    atomData).position.
                                    super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start +
                            (pAVar5->super_StuntDouble).storage_);
          local_68[2] = (double)*(undefined8 *)(lVar14 + 0x10 + lVar11 * 0x18);
          pdVar1 = (double *)(lVar14 + lVar11 * 0x18);
          local_68[0] = *pdVar1;
          local_68[1] = pdVar1[1];
          pAVar5 = pHVar4->donatedHydrogen;
          lVar11 = (long)(pAVar5->super_StuntDouble).localIndex_;
          lVar14 = *(long *)((long)&(((pAVar5->super_StuntDouble).snapshotMan_)->currentSnapshot_->
                                    atomData).position.
                                    super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start +
                            (pAVar5->super_StuntDouble).storage_);
          local_a8[2] = (double)*(undefined8 *)(lVar14 + 0x10 + lVar11 * 0x18);
          pdVar1 = (double *)(lVar14 + lVar11 * 0x18);
          local_a8[0] = *pdVar1;
          local_a8[1] = pdVar1[1];
          local_148.bitsets_.
          super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_148.bitsets_.
          super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_148.bitsets_.
          super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          lVar14 = 0;
          do {
            (&local_148.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_start)[lVar14] =
                 (pointer)(local_a8[lVar14] - local_68[lVar14]);
            lVar14 = lVar14 + 1;
          } while (lVar14 != 3);
          local_f8.super_Vector<double,_3U>.data_[2] =
               (double)local_148.bitsets_.
                       super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
          local_f8.super_Vector<double,_3U>.data_[0] =
               (double)local_148.bitsets_.
                       super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                       ._M_impl.super__Vector_impl_data._M_start;
          local_f8.super_Vector<double,_3U>.data_[1] =
               (double)local_148.bitsets_.
                       super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
          Snapshot::wrapVector((this->super_TimeCorrFunc<double>).currentSnapshot_,&local_f8);
          dVar8 = 0.0;
          lVar14 = 0;
          do {
            dVar3 = local_f8.super_Vector<double,_3U>.data_[lVar14];
            dVar8 = dVar8 + dVar3 * dVar3;
            lVar14 = lVar14 + 1;
          } while (lVar14 != 3);
          if (dVar8 < 0.0) {
            local_128 = sqrt(dVar8);
          }
          else {
            local_128 = SQRT(dVar8);
          }
          local_14c = (pHVar4->donatedHydrogen->super_StuntDouble).globalIndex_;
          local_150 = -1;
          for (ppAVar13 = (pMVar10->hBondAcceptors_).
                          super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
                          _M_impl.super__Vector_impl_data._M_start;
              (ppAVar13 !=
               (pMVar10->hBondAcceptors_).
               super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
               super__Vector_impl_data._M_finish && (pAVar5 = *ppAVar13, pAVar5 != (Atom *)0x0));
              ppAVar13 = ppAVar13 + 1) {
            lVar11 = (long)(pAVar5->super_StuntDouble).localIndex_;
            lVar14 = *(long *)((long)&(((pAVar5->super_StuntDouble).snapshotMan_)->currentSnapshot_
                                      ->atomData).position.
                                      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start +
                              (pAVar5->super_StuntDouble).storage_);
            local_88[2] = (double)*(undefined8 *)(lVar14 + 0x10 + lVar11 * 0x18);
            pdVar1 = (double *)(lVar14 + lVar11 * 0x18);
            local_88[0] = *pdVar1;
            local_88[1] = pdVar1[1];
            local_148.bitsets_.
            super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_148.bitsets_.
            super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_148.bitsets_.
            super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            lVar14 = 0;
            do {
              (&local_148.bitsets_.
                super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                _M_impl.super__Vector_impl_data._M_start)[lVar14] =
                   (pointer)(local_88[lVar14] - local_68[lVar14]);
              lVar14 = lVar14 + 1;
            } while (lVar14 != 3);
            local_118.super_Vector<double,_3U>.data_[2] =
                 (double)local_148.bitsets_.
                         super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
            local_118.super_Vector<double,_3U>.data_[0] =
                 (double)local_148.bitsets_.
                         super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                         ._M_impl.super__Vector_impl_data._M_start;
            local_118.super_Vector<double,_3U>.data_[1] =
                 (double)local_148.bitsets_.
                         super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
            Snapshot::wrapVector((this->super_TimeCorrFunc<double>).currentSnapshot_,&local_118);
            dVar8 = 0.0;
            lVar14 = 0;
            do {
              dVar3 = local_118.super_Vector<double,_3U>.data_[lVar14];
              dVar8 = dVar8 + dVar3 * dVar3;
              lVar14 = lVar14 + 1;
            } while (lVar14 != 3);
            if (dVar8 < 0.0) {
              dVar8 = sqrt(dVar8);
            }
            else {
              dVar8 = SQRT(dVar8);
            }
            if (dVar8 < this->OOCut_) {
              local_148.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_148.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              local_148.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              lVar14 = 0;
              do {
                (&local_148.bitsets_.
                  super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                  _M_impl.super__Vector_impl_data._M_start)[lVar14] =
                     (pointer)(local_88[lVar14] - local_a8[lVar14]);
                lVar14 = lVar14 + 1;
              } while (lVar14 != 3);
              local_c8.super_Vector<double,_3U>.data_[2] =
                   (double)local_148.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
              local_c8.super_Vector<double,_3U>.data_[0] =
                   (double)local_148.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start;
              local_c8.super_Vector<double,_3U>.data_[1] =
                   (double)local_148.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
              local_d8 = dVar8;
              Snapshot::wrapVector((this->super_TimeCorrFunc<double>).currentSnapshot_,&local_c8);
              dVar8 = 0.0;
              lVar14 = 0;
              do {
                dVar3 = local_c8.super_Vector<double,_3U>.data_[lVar14];
                dVar8 = dVar8 + dVar3 * dVar3;
                lVar14 = lVar14 + 1;
              } while (lVar14 != 3);
              if (dVar8 < 0.0) {
                local_120 = sqrt(dVar8);
              }
              else {
                local_120 = SQRT(dVar8);
              }
              dVar8 = 0.0;
              lVar14 = 0;
              do {
                dVar8 = dVar8 + local_f8.super_Vector<double,_3U>.data_[lVar14] *
                                local_118.super_Vector<double,_3U>.data_[lVar14];
                lVar14 = lVar14 + 1;
              } while (lVar14 != 3);
              dVar8 = acos(dVar8 / (local_d8 * local_128));
              if (((dVar8 * 180.0) / 3.141592653589793 < this->thetaCut_) &&
                 (local_120 < this->OHCut_)) {
                local_150 = (pAVar5->super_StuntDouble).globalIndex_;
                pvVar6 = (this->acceptor_).
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                iVar7._M_current =
                     *(pointer *)
                      ((long)&pvVar6[local_40].super__Vector_base<int,_std::allocator<int>_>._M_impl
                              .super__Vector_impl_data + 8);
                *(int *)(*(long *)&(this->GIDtoDonor_).
                                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[local_40].
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data + (long)local_14c * 4) =
                     (int)((ulong)((long)iVar7._M_current -
                                  *(long *)&pvVar6[local_40].
                                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                            super__Vector_impl_data) >> 2);
                if (iVar7._M_current ==
                    *(pointer *)
                     ((long)&pvVar6[local_40].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data + 0x10)) {
                  std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                            ((vector<int,std::allocator<int>> *)(pvVar6 + local_40),iVar7,&local_150
                            );
                }
                else {
                  *iVar7._M_current = local_150;
                  *(int **)((vector<int,std::allocator<int>> *)(pvVar6 + local_40) + 8) =
                       iVar7._M_current + 1;
                }
                pvVar2 = (vector<int,std::allocator<int>> *)
                         ((long)&(((this->DonorToGID_).
                                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                 super__Vector_impl_data + local_48 * 8);
                iVar7._M_current = *(int **)(pvVar2 + 8);
                if (iVar7._M_current == *(int **)(pvVar2 + 0x10)) {
                  std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                            (pvVar2,iVar7,&local_14c);
                }
                else {
                  *iVar7._M_current = local_14c;
                  *(int **)(pvVar2 + 8) = iVar7._M_current + 1;
                }
              }
            }
          }
        }
        for (ppHVar12 = (pMVar10->hBondDonors_).
                        super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            (ppHVar12 !=
             (pMVar10->hBondDonors_).
             super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
             ._M_impl.super__Vector_impl_data._M_finish &&
            (pHVar4 = *ppHVar12, pHVar4 != (HBondDonor *)0x0)); ppHVar12 = ppHVar12 + 1) {
          pAVar5 = pHVar4->donorAtom;
          lVar11 = (long)(pAVar5->super_StuntDouble).localIndex_;
          lVar14 = *(long *)((long)&(((pAVar5->super_StuntDouble).snapshotMan_)->currentSnapshot_->
                                    atomData).position.
                                    super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start +
                            (pAVar5->super_StuntDouble).storage_);
          local_68[2] = (double)*(undefined8 *)(lVar14 + 0x10 + lVar11 * 0x18);
          pdVar1 = (double *)(lVar14 + lVar11 * 0x18);
          local_68[0] = *pdVar1;
          local_68[1] = pdVar1[1];
          pAVar5 = pHVar4->donatedHydrogen;
          lVar11 = (long)(pAVar5->super_StuntDouble).localIndex_;
          lVar14 = *(long *)((long)&(((pAVar5->super_StuntDouble).snapshotMan_)->currentSnapshot_->
                                    atomData).position.
                                    super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start +
                            (pAVar5->super_StuntDouble).storage_);
          local_a8[2] = (double)*(undefined8 *)(lVar14 + 0x10 + lVar11 * 0x18);
          pdVar1 = (double *)(lVar14 + lVar11 * 0x18);
          local_a8[0] = *pdVar1;
          local_a8[1] = pdVar1[1];
          local_148.bitsets_.
          super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_148.bitsets_.
          super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_148.bitsets_.
          super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          lVar14 = 0;
          do {
            (&local_148.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_start)[lVar14] =
                 (pointer)(local_a8[lVar14] - local_68[lVar14]);
            lVar14 = lVar14 + 1;
          } while (lVar14 != 3);
          local_f8.super_Vector<double,_3U>.data_[2] =
               (double)local_148.bitsets_.
                       super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
          local_f8.super_Vector<double,_3U>.data_[0] =
               (double)local_148.bitsets_.
                       super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                       ._M_impl.super__Vector_impl_data._M_start;
          local_f8.super_Vector<double,_3U>.data_[1] =
               (double)local_148.bitsets_.
                       super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
          Snapshot::wrapVector((this->super_TimeCorrFunc<double>).currentSnapshot_,&local_f8);
          dVar8 = 0.0;
          lVar14 = 0;
          do {
            dVar3 = local_f8.super_Vector<double,_3U>.data_[lVar14];
            dVar8 = dVar8 + dVar3 * dVar3;
            lVar14 = lVar14 + 1;
          } while (lVar14 != 3);
          if (dVar8 < 0.0) {
            local_128 = sqrt(dVar8);
          }
          else {
            local_128 = SQRT(dVar8);
          }
          local_14c = (pHVar4->donatedHydrogen->super_StuntDouble).globalIndex_;
          local_150 = -1;
          for (ppAVar13 = (pMVar9->hBondAcceptors_).
                          super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
                          _M_impl.super__Vector_impl_data._M_start;
              (ppAVar13 !=
               (pMVar9->hBondAcceptors_).
               super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
               super__Vector_impl_data._M_finish && (pAVar5 = *ppAVar13, pAVar5 != (Atom *)0x0));
              ppAVar13 = ppAVar13 + 1) {
            lVar11 = (long)(pAVar5->super_StuntDouble).localIndex_;
            lVar14 = *(long *)((long)&(((pAVar5->super_StuntDouble).snapshotMan_)->currentSnapshot_
                                      ->atomData).position.
                                      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start +
                              (pAVar5->super_StuntDouble).storage_);
            local_88[2] = (double)*(undefined8 *)(lVar14 + 0x10 + lVar11 * 0x18);
            pdVar1 = (double *)(lVar14 + lVar11 * 0x18);
            local_88[0] = *pdVar1;
            local_88[1] = pdVar1[1];
            local_148.bitsets_.
            super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_148.bitsets_.
            super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_148.bitsets_.
            super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            lVar14 = 0;
            do {
              (&local_148.bitsets_.
                super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                _M_impl.super__Vector_impl_data._M_start)[lVar14] =
                   (pointer)(local_88[lVar14] - local_68[lVar14]);
              lVar14 = lVar14 + 1;
            } while (lVar14 != 3);
            local_118.super_Vector<double,_3U>.data_[2] =
                 (double)local_148.bitsets_.
                         super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
            local_118.super_Vector<double,_3U>.data_[0] =
                 (double)local_148.bitsets_.
                         super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                         ._M_impl.super__Vector_impl_data._M_start;
            local_118.super_Vector<double,_3U>.data_[1] =
                 (double)local_148.bitsets_.
                         super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
            Snapshot::wrapVector((this->super_TimeCorrFunc<double>).currentSnapshot_,&local_118);
            dVar8 = 0.0;
            lVar14 = 0;
            do {
              dVar3 = local_118.super_Vector<double,_3U>.data_[lVar14];
              dVar8 = dVar8 + dVar3 * dVar3;
              lVar14 = lVar14 + 1;
            } while (lVar14 != 3);
            if (dVar8 < 0.0) {
              dVar8 = sqrt(dVar8);
            }
            else {
              dVar8 = SQRT(dVar8);
            }
            if (dVar8 < this->OOCut_) {
              local_148.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_148.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              local_148.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              lVar14 = 0;
              do {
                (&local_148.bitsets_.
                  super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                  _M_impl.super__Vector_impl_data._M_start)[lVar14] =
                     (pointer)(local_88[lVar14] - local_a8[lVar14]);
                lVar14 = lVar14 + 1;
              } while (lVar14 != 3);
              local_c8.super_Vector<double,_3U>.data_[2] =
                   (double)local_148.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
              local_c8.super_Vector<double,_3U>.data_[0] =
                   (double)local_148.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start;
              local_c8.super_Vector<double,_3U>.data_[1] =
                   (double)local_148.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
              local_d8 = dVar8;
              Snapshot::wrapVector((this->super_TimeCorrFunc<double>).currentSnapshot_,&local_c8);
              dVar8 = 0.0;
              lVar14 = 0;
              do {
                dVar3 = local_c8.super_Vector<double,_3U>.data_[lVar14];
                dVar8 = dVar8 + dVar3 * dVar3;
                lVar14 = lVar14 + 1;
              } while (lVar14 != 3);
              if (dVar8 < 0.0) {
                local_120 = sqrt(dVar8);
              }
              else {
                local_120 = SQRT(dVar8);
              }
              dVar8 = 0.0;
              lVar14 = 0;
              do {
                dVar8 = dVar8 + local_f8.super_Vector<double,_3U>.data_[lVar14] *
                                local_118.super_Vector<double,_3U>.data_[lVar14];
                lVar14 = lVar14 + 1;
              } while (lVar14 != 3);
              dVar8 = acos(dVar8 / (local_d8 * local_128));
              if (((dVar8 * 180.0) / 3.141592653589793 < this->thetaCut_) &&
                 (local_120 < this->OHCut_)) {
                local_150 = (pAVar5->super_StuntDouble).globalIndex_;
                pvVar6 = (this->acceptor_).
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                iVar7._M_current =
                     *(pointer *)
                      ((long)&pvVar6[local_40].super__Vector_base<int,_std::allocator<int>_>._M_impl
                              .super__Vector_impl_data + 8);
                *(int *)(*(long *)&(this->GIDtoDonor_).
                                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[local_40].
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data + (long)local_14c * 4) =
                     (int)((ulong)((long)iVar7._M_current -
                                  *(long *)&pvVar6[local_40].
                                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                            super__Vector_impl_data) >> 2);
                if (iVar7._M_current ==
                    *(pointer *)
                     ((long)&pvVar6[local_40].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data + 0x10)) {
                  std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                            ((vector<int,std::allocator<int>> *)(pvVar6 + local_40),iVar7,&local_150
                            );
                }
                else {
                  *iVar7._M_current = local_150;
                  *(int **)((vector<int,std::allocator<int>> *)(pvVar6 + local_40) + 8) =
                       iVar7._M_current + 1;
                }
                pvVar2 = (vector<int,std::allocator<int>> *)
                         ((long)&(((this->DonorToGID_).
                                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                 super__Vector_impl_data + local_48 * 8);
                iVar7._M_current = *(int **)(pvVar2 + 8);
                if (iVar7._M_current == *(int **)(pvVar2 + 0x10)) {
                  std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                            (pvVar2,iVar7,&local_14c);
                }
                else {
                  *iVar7._M_current = local_14c;
                  *(int **)(pvVar2 + 8) = iVar7._M_current + 1;
                }
              }
            }
          }
        }
        pMVar10 = SelectionManager::nextSelectedMolecule(local_50,&local_d0);
      }
      pMVar9 = SelectionManager::nextSelectedMolecule(local_38,&local_cc);
    } while (pMVar9 != (Molecule *)0x0);
  }
  return;
}

Assistant:

void HBondPersistence::computeFrame(int istep) {
    Molecule* mol1;
    Molecule* mol2;
    std::vector<Molecule::HBondDonor*>::iterator hbdi;
    Molecule::HBondDonor* hbd;
    std::vector<Atom*>::iterator hbai;
    Atom* hba;
    Vector3d dPos;
    Vector3d aPos;
    Vector3d hPos;
    Vector3d DH;
    Vector3d DA;
    Vector3d HA;
    Vector3d uDA;
    RealType DAdist, DHdist, HAdist, theta, ctheta;
    int ii, jj;
    int hInd, aInd, index;

    // Map of atomic global IDs to donor atoms:
    GIDtoDonor_[istep].resize(info_->getNGlobalAtoms(), -1);

    if (!uniqueSelections_) { seleMan2_ = seleMan1_; }

    if (evaluator1_.isDynamic()) {
      seleMan1_.setSelectionSet(evaluator1_.evaluate());
    }

    if (uniqueSelections_ && evaluator2_.isDynamic()) {
      seleMan2_.setSelectionSet(evaluator2_.evaluate());
    }

    for (mol1 = seleMan1_.beginSelectedMolecule(ii); mol1 != NULL;
         mol1 = seleMan1_.nextSelectedMolecule(ii)) {
      for (mol2 = seleMan2_.beginSelectedMolecule(jj); mol2 != NULL;
           mol2 = seleMan2_.nextSelectedMolecule(jj)) {
        // loop over the possible donors in molecule 1:
        for (hbd = mol1->beginHBondDonor(hbdi); hbd != NULL;
             hbd = mol1->nextHBondDonor(hbdi)) {
          dPos = hbd->donorAtom->getPos();
          hPos = hbd->donatedHydrogen->getPos();
          DH   = hPos - dPos;
          currentSnapshot_->wrapVector(DH);
          DHdist = DH.length();

          hInd = hbd->donatedHydrogen->getGlobalIndex();
          aInd = -1;

          // loop over the possible acceptors in molecule 2:
          for (hba = mol2->beginHBondAcceptor(hbai); hba != NULL;
               hba = mol2->nextHBondAcceptor(hbai)) {
            aPos = hba->getPos();
            DA   = aPos - dPos;
            currentSnapshot_->wrapVector(DA);
            DAdist = DA.length();

            // Distance criteria: are the donor and acceptor atoms
            // close enough?
            if (DAdist < OOCut_) {
              HA = aPos - hPos;
              currentSnapshot_->wrapVector(HA);
              HAdist = HA.length();

              ctheta = dot(DH, DA) / (DHdist * DAdist);
              theta  = acos(ctheta) * 180.0 / Constants::PI;

              // Angle criteria: are the D-H and D-A and vectors close?
              if (theta < thetaCut_ && HAdist < OHCut_) {
                // molecule 2 is a Hbond acceptor:
                aInd = hba->getGlobalIndex();

                index                    = acceptor_[istep].size();
                GIDtoDonor_[istep][hInd] = index;

                acceptor_[istep].push_back(aInd);
                DonorToGID_[istep].push_back(hInd);
              }
            }
          }
        }

        // loop over the possible donors in molecule 2:
        for (hbd = mol2->beginHBondDonor(hbdi); hbd != NULL;
             hbd = mol2->nextHBondDonor(hbdi)) {
          dPos = hbd->donorAtom->getPos();
          hPos = hbd->donatedHydrogen->getPos();
          DH   = hPos - dPos;
          currentSnapshot_->wrapVector(DH);
          DHdist = DH.length();

          hInd = hbd->donatedHydrogen->getGlobalIndex();
          aInd = -1;

          // loop over the possible acceptors in molecule 1:
          for (hba = mol1->beginHBondAcceptor(hbai); hba != NULL;
               hba = mol1->nextHBondAcceptor(hbai)) {
            aPos = hba->getPos();
            DA   = aPos - dPos;
            currentSnapshot_->wrapVector(DA);
            DAdist = DA.length();

            // Distance criteria: are the donor and acceptor atoms
            // close enough?
            if (DAdist < OOCut_) {
              HA = aPos - hPos;
              currentSnapshot_->wrapVector(HA);
              HAdist = HA.length();

              ctheta = dot(DH, DA) / (DHdist * DAdist);
              theta  = acos(ctheta) * 180.0 / Constants::PI;

              // Angle criteria: are the D-H and D-A and vectors close?
              if (theta < thetaCut_ && HAdist < OHCut_) {
                // molecule 1 is a Hbond acceptor:
                aInd                     = hba->getGlobalIndex();
                index                    = acceptor_[istep].size();
                GIDtoDonor_[istep][hInd] = index;

                acceptor_[istep].push_back(aInd);
                DonorToGID_[istep].push_back(hInd);
              }
            }
          }
        }
      }
    }
  }